

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Url.cpp
# Opt level: O0

void __thiscall xmrig::Url::Url(Url *this,char *host,uint16_t port,bool tls,Scheme scheme)

{
  size_t sVar1;
  String *this_00;
  size_t __maxlen;
  char *pcVar2;
  byte in_CL;
  undefined2 in_DX;
  byte *in_RDI;
  undefined4 in_R8D;
  char *url;
  size_t size;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff88;
  String *in_stack_ffffffffffffff90;
  
  *in_RDI = in_CL & 1;
  *(undefined4 *)(in_RDI + 4) = in_R8D;
  String::String(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  String::String((String *)(in_RDI + 0x18));
  *(undefined2 *)(in_RDI + 0x28) = in_DX;
  sVar1 = String::size((String *)(in_RDI + 8));
  this_00 = (String *)operator_new__(sVar1 + 8);
  memset(this_00,0,sVar1 + 8);
  __maxlen = sVar1 + 7;
  pcVar2 = String::data((String *)(in_RDI + 8));
  snprintf((char *)this_00,__maxlen,"%s:%d",pcVar2,(ulong)*(ushort *)(in_RDI + 0x28));
  String::operator=(this_00,in_stack_ffffffffffffff78);
  return;
}

Assistant:

xmrig::Url::Url(const char *host, uint16_t port, bool tls, Scheme scheme) :
    m_tls(tls),
    m_scheme(scheme),
    m_host(host),
    m_port(port)
{
    const size_t size = m_host.size() + 8;
    assert(size > 8);

    char *url = new char[size]();
    snprintf(url, size - 1, "%s:%d", m_host.data(), m_port);

    m_url = url;
}